

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

int Kit_TruthVarsSymm(uint *pTruth,int nVars,int iVar0,int iVar1,uint *pCof0,uint *pCof1)

{
  int iVar2;
  uint *local_30;
  uint *pCof1_local;
  uint *pCof0_local;
  int iVar1_local;
  int iVar0_local;
  int nVars_local;
  uint *pTruth_local;
  
  pCof1_local = pCof0;
  if (pCof0 == (uint *)0x0) {
    if (10 < nVars) {
      __assert_fail("nVars <= 10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                    ,0x4a8,
                    "int Kit_TruthVarsSymm(unsigned int *, int, int, int, unsigned int *, unsigned int *)"
                   );
    }
    pCof1_local = Kit_TruthVarsSymm::uTemp0;
  }
  local_30 = pCof1;
  if (pCof1 == (uint *)0x0) {
    if (10 < nVars) {
      __assert_fail("nVars <= 10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                    ,0x4ad,
                    "int Kit_TruthVarsSymm(unsigned int *, int, int, int, unsigned int *, unsigned int *)"
                   );
    }
    local_30 = Kit_TruthVarsSymm::uTemp1;
  }
  Kit_TruthCopy(pCof1_local,pTruth,nVars);
  Kit_TruthCofactor0(pCof1_local,nVars,iVar0);
  Kit_TruthCofactor1(pCof1_local,nVars,iVar1);
  Kit_TruthCopy(local_30,pTruth,nVars);
  Kit_TruthCofactor1(local_30,nVars,iVar0);
  Kit_TruthCofactor0(local_30,nVars,iVar1);
  iVar2 = Kit_TruthIsEqual(pCof1_local,local_30,nVars);
  return iVar2;
}

Assistant:

int Kit_TruthVarsSymm( unsigned * pTruth, int nVars, int iVar0, int iVar1, unsigned * pCof0, unsigned * pCof1 )
{
    static unsigned uTemp0[32], uTemp1[32];
    if ( pCof0 == NULL )
    {
        assert( nVars <= 10 );
        pCof0 = uTemp0;
    }
    if ( pCof1 == NULL )
    {
        assert( nVars <= 10 );
        pCof1 = uTemp1;
    }
    // compute Cof01
    Kit_TruthCopy( pCof0, pTruth, nVars );
    Kit_TruthCofactor0( pCof0, nVars, iVar0 );
    Kit_TruthCofactor1( pCof0, nVars, iVar1 );
    // compute Cof10
    Kit_TruthCopy( pCof1, pTruth, nVars );
    Kit_TruthCofactor1( pCof1, nVars, iVar0 );
    Kit_TruthCofactor0( pCof1, nVars, iVar1 );
    // compare
    return Kit_TruthIsEqual( pCof0, pCof1, nVars );
}